

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1parse.c
# Opt level: O0

FT_Error read_pfb_tag(FT_Stream stream,FT_UShort *atag,FT_ULong *asize)

{
  FT_ULong FVar1;
  FT_ULong size;
  FT_UShort tag;
  FT_ULong *pFStack_20;
  FT_Error error;
  FT_ULong *asize_local;
  FT_UShort *atag_local;
  FT_Stream stream_local;
  
  *atag = 0;
  *asize = 0;
  pFStack_20 = asize;
  asize_local = (FT_ULong *)atag;
  atag_local = (FT_UShort *)stream;
  size._2_2_ = FT_Stream_ReadUShort(stream,(FT_Error *)((long)&size + 4));
  if (size._4_4_ == 0) {
    if (((size._2_2_ == 0x8001) || (size._2_2_ == 0x8002)) &&
       (FVar1 = FT_Stream_ReadULongLE((FT_Stream)atag_local,(FT_Error *)((long)&size + 4)),
       size._4_4_ == 0)) {
      *pFStack_20 = FVar1;
    }
    *(FT_UShort *)asize_local = size._2_2_;
  }
  return size._4_4_;
}

Assistant:

static FT_Error
  read_pfb_tag( FT_Stream   stream,
                FT_UShort  *atag,
                FT_ULong   *asize )
  {
    FT_Error   error;
    FT_UShort  tag;
    FT_ULong   size;


    *atag  = 0;
    *asize = 0;

    if ( !FT_READ_USHORT( tag ) )
    {
      if ( tag == 0x8001U || tag == 0x8002U )
      {
        if ( !FT_READ_ULONG_LE( size ) )
          *asize = size;
      }

      *atag = tag;
    }

    return error;
  }